

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O3

void Vga_ManStop(Vta_Man_t *p)

{
  sat_solver2 *psVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  int iVar4;
  Vec_Bit_t *__ptr;
  Vec_Int_t *pVVar5;
  long lVar6;
  
  if (p->pPars->fVerbose != 0) {
    psVar1 = p->pSat;
    Abc_Print(psVar1->nDBreduces,
              "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  Objs+ = %d\n"
              ,(ulong)(uint)psVar1->size,(ulong)(psVar1->stats).clauses,
              (ulong)(uint)(psVar1->stats).conflicts,(ulong)(psVar1->stats).learnts,
              (ulong)(uint)psVar1->nDBreduces,(ulong)(uint)p->nCexes,(ulong)(uint)p->nObjAdded);
  }
  pVVar2 = p->vCores;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    iVar4 = pVVar2->nSize;
    if (0 < iVar4) {
      lVar6 = 0;
      do {
        pvVar3 = pVVar2->pArray[lVar6];
        if (pvVar3 != (void *)0x0) {
          if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar3 + 8));
          }
          free(pvVar3);
          iVar4 = pVVar2->nSize;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar4);
    }
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
    }
    free(pVVar2);
    p->vCores = (Vec_Ptr_t *)0x0;
  }
  pVVar2 = p->vFrames;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    iVar4 = pVVar2->nSize;
    if (0 < iVar4) {
      lVar6 = 0;
      do {
        pvVar3 = pVVar2->pArray[lVar6];
        if (pvVar3 != (void *)0x0) {
          if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar3 + 8));
          }
          free(pvVar3);
          iVar4 = pVVar2->nSize;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar4);
    }
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
    }
    free(pVVar2);
    p->vFrames = (Vec_Ptr_t *)0x0;
  }
  __ptr = p->vSeenGla;
  if (__ptr != (Vec_Bit_t *)0x0) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      p->vSeenGla->pArray = (int *)0x0;
      __ptr = p->vSeenGla;
      if (__ptr == (Vec_Bit_t *)0x0) goto LAB_006265d7;
    }
    free(__ptr);
    p->vSeenGla = (Vec_Bit_t *)0x0;
  }
LAB_006265d7:
  pVVar5 = p->vSeens;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      p->vSeens->pArray = (int *)0x0;
      pVVar5 = p->vSeens;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_00626613;
    }
    free(pVVar5);
    p->vSeens = (Vec_Int_t *)0x0;
  }
LAB_00626613:
  pVVar5 = p->vOrder;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      p->vOrder->pArray = (int *)0x0;
      pVVar5 = p->vOrder;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_0062664f;
    }
    free(pVVar5);
    p->vOrder = (Vec_Int_t *)0x0;
  }
LAB_0062664f:
  pVVar5 = p->vAddedNew;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      p->vAddedNew->pArray = (int *)0x0;
      pVVar5 = p->vAddedNew;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_00626697;
    }
    free(pVVar5);
    p->vAddedNew = (Vec_Int_t *)0x0;
  }
LAB_00626697:
  sat_solver2_delete(p->pSat);
  if (p->pBins != (int *)0x0) {
    free(p->pBins);
    p->pBins = (int *)0x0;
  }
  if (p->pObjs != (Vta_Obj_t *)0x0) {
    free(p->pObjs);
  }
  free(p);
  return;
}

Assistant:

void Vga_ManStop( Vta_Man_t * p )
{
    if ( p->pPars->fVerbose )
        Abc_Print( 1, "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  Objs+ = %d\n", 
            sat_solver2_nvars(p->pSat), sat_solver2_nclauses(p->pSat), sat_solver2_nconflicts(p->pSat), 
            sat_solver2_nlearnts(p->pSat), p->pSat->nDBreduces, p->nCexes, p->nObjAdded );
    Vec_VecFreeP( (Vec_Vec_t **)&p->vCores );
    Vec_VecFreeP( (Vec_Vec_t **)&p->vFrames );
    Vec_BitFreeP( &p->vSeenGla );
    Vec_IntFreeP( &p->vSeens );
    Vec_IntFreeP( &p->vOrder );
    Vec_IntFreeP( &p->vAddedNew );
    sat_solver2_delete( p->pSat );
    ABC_FREE( p->pBins );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}